

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

stb_ps * stb_ps_remove(stb_ps *ps,void *value)

{
  stb_ps *psVar1;
  stb_ps *__ptr;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined8 *puVar5;
  stb_ps_hash *psVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  stb_ps *unaff_R14;
  stb_ps *psVar12;
  
  if (((ulong)value & 3) != 0) {
    __assert_fail("(3 & (int) value) == STB_ps_direct",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x1e7a,"stb_ps *stb_ps_remove(stb_ps *, void *)");
  }
  psVar12 = ps;
  if (value != (void *)0x0) {
    switch((uint)ps & 3) {
    case 0:
      psVar12 = (stb_ps *)0x0;
      if (ps != (stb_ps *)value) {
        psVar12 = ps;
      }
      break;
    case 1:
      psVar1 = ps + -1;
      if (*(void **)(ps + -1) == value) {
        *(long *)psVar1 = 0;
        uVar8 = 0;
      }
      else {
        uVar8 = (uint)(*(void **)(ps + -1) != (void *)0x0);
      }
      if (*(void **)(ps + 7) == value) {
        *(undefined8 *)(ps + 7) = 0;
      }
      else {
        uVar8 = (uVar8 + 1) - (uint)(*(void **)(ps + 7) == (void *)0x0);
      }
      if (*(void **)(ps + 0xf) == value) {
        *(undefined8 *)(ps + 0xf) = 0;
      }
      else {
        uVar8 = (uVar8 + 1) - (uint)(*(void **)(ps + 0xf) == (void *)0x0);
      }
      if (*(void **)(ps + 0x17) == value) {
        *(undefined8 *)(ps + 0x17) = 0;
      }
      else {
        uVar8 = (uVar8 + 1) - (uint)(*(void **)(ps + 0x17) == (void *)0x0);
      }
      if (uVar8 == 1) {
        psVar12 = *(stb_ps **)psVar1;
        if (psVar12 == (stb_ps *)0x0) {
          psVar12 = *(stb_ps **)(ps + 7);
        }
        if (psVar12 == (stb_ps *)0x0) {
          psVar12 = *(stb_ps **)(ps + 0xf);
        }
        if (psVar12 == (stb_ps *)0x0) {
          psVar12 = *(stb_ps **)(ps + 0x17);
        }
        if (psVar12 == (stb_ps *)0x0) {
          __assert_fail("value != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x1e8c,"stb_ps *stb_ps_remove(stb_ps *, void *)");
        }
        free(psVar1);
      }
      break;
    case 2:
      lVar10 = (long)*(int *)(ps + -2);
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          if (*(void **)(ps + lVar11 * 8 + 6) == value) {
            iVar7 = *(int *)(ps + -2) + -1;
            *(int *)(ps + -2) = iVar7;
            *(undefined8 *)(ps + lVar11 * 8 + 6) = *(undefined8 *)(ps + lVar10 * 8 + -2);
            if (iVar7 != 3) {
              return ps;
            }
            puVar5 = (undefined8 *)malloc(0x20);
            *puVar5 = *(undefined8 *)(ps + 6);
            puVar5[1] = *(undefined8 *)(ps + 0xe);
            puVar5[2] = *(undefined8 *)(ps + 0x16);
            puVar5[3] = 0;
            free(ps + -2);
            return (stb_ps *)((long)puVar5 + 1);
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      break;
    case 3:
      iVar7 = ((uint)((ulong)value >> 0x13) & 0x1fff) +
              ((uint)((ulong)value >> 6) & 0x3ffffff) + (int)value;
      uVar8 = iVar7 * 0x80008 ^ iVar7 * 0x10001;
      uVar8 = (uVar8 >> 5) + uVar8;
      uVar8 = uVar8 * 4 ^ uVar8;
      uVar8 = (uVar8 >> 0xf) + uVar8;
      uVar8 = uVar8 * 0x400 ^ uVar8;
      uVar8 = (uVar8 >> 0x13) + (uVar8 >> 6) + uVar8;
      uVar9 = (ulong)(*(uint *)(ps + 1) & uVar8);
      psVar1 = ps + 0x1d;
      if (*(void **)(ps + uVar9 * 8 + 0x1d) != value) {
        do {
          uVar9 = (ulong)((int)uVar9 + ((uVar8 >> 0x13) + (uVar8 >> 6) + uVar8 | 1) &
                         *(uint *)(ps + 1));
        } while (*(void **)(psVar1 + uVar9 * 8) != value);
      }
      __ptr = ps + -3;
      *(undefined8 *)(ps + uVar9 * 8 + 0x1d) = 1;
      iVar7 = *(int *)(ps + 5);
      *(int *)(ps + 5) = iVar7 + -1;
      *(int *)(ps + 9) = *(int *)(ps + 9) + 1;
      if (iVar7 < 0xe) {
        if (iVar7 < 9) {
          piVar4 = (int *)malloc(0x48);
          iVar2 = *(int *)__ptr;
          if ((long)iVar2 < 1) {
            iVar3 = 0;
          }
          else {
            lVar10 = 0;
            iVar3 = 0;
            do {
              if ((*(ulong *)(psVar1 + lVar10 * 8) & 0xfffffffe) != 0) {
                lVar11 = (long)iVar3;
                iVar3 = iVar3 + 1;
                *(ulong *)(piVar4 + lVar11 * 2 + 2) = *(ulong *)(psVar1 + lVar10 * 8);
              }
              lVar10 = lVar10 + 1;
            } while (iVar2 != lVar10);
          }
          if (iVar3 != iVar7 + -1) {
            __assert_fail("j == h->count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                          ,0x1eb9,"stb_ps *stb_ps_remove(stb_ps *, void *)");
          }
          *piVar4 = iVar3;
          free(__ptr);
          unaff_R14 = (stb_ps *)((long)piVar4 + 2);
        }
        if (iVar7 < 9) {
          return unaff_R14;
        }
      }
      if (*(int *)(ps + 5) == *(int *)(ps + 0x11)) {
        psVar6 = stb_ps_makehash(*(int *)__ptr >> 1,*(int *)__ptr,(void **)psVar1);
        free(__ptr);
        psVar12 = (stb_ps *)((long)&psVar6->size + 3);
      }
    }
  }
  return psVar12;
}

Assistant:

stb_ps *stb_ps_remove(stb_ps *ps, void *value)
{
   #ifdef STB_DEBUG
   assert(stb_ps_find(ps, value));
   #endif
   assert((3 & (int) value) == STB_ps_direct);
   if (value == NULL) return ps; // ignore NULL removes to avoid bad breakage
   switch (3 & (int) ps) {
      case STB_ps_direct:
         return ps == value ? NULL : ps;
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         int count=0;
         assert(STB_BUCKET_SIZE == 4);
         if (b->p[0] == value) b->p[0] = NULL; else count += (b->p[0] != NULL);
         if (b->p[1] == value) b->p[1] = NULL; else count += (b->p[1] != NULL);
         if (b->p[2] == value) b->p[2] = NULL; else count += (b->p[2] != NULL);
         if (b->p[3] == value) b->p[3] = NULL; else count += (b->p[3] != NULL);
         if (count == 1) { // shrink bucket at size 1
            value = b->p[0];
            if (value == NULL) value = b->p[1];
            if (value == NULL) value = b->p[2];
            if (value == NULL) value = b->p[3];
            assert(value != NULL);
            stb_bucket_free(b);
            return (stb_ps *) value; // return STB_ps_direct of value
         }
         return ps;
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         int i;
         for (i=0; i < a->count; ++i) {
            if (a->p[i] == value) {
               a->p[i] = a->p[--a->count];
               if (a->count == 3) { // shrink to bucket!
                  stb_ps_bucket *b = stb_bucket_create3(a->p);
                  free(a);
                  return EncodeBucket(b);
               }
               return ps;
            }
         }
         return ps;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         stb_uint32 hash = stb_hashptr(value);
         stb_uint32 s, n = hash & h->mask;
         void **t = h->table;
         if (t[n] != value) {
            s = stb_rehash(hash) | 1;
            do {
               n = (n + s) & h->mask;
            } while (t[n] != value);
         }
         t[n] = STB_DEL;
         -- h->count;
         ++ h->count_deletes;
         // should we shrink down to an array?
         if (h->count < stb_ps_array_max) {
            int n = 1 << stb_log2_floor(stb_ps_array_max);
            if (h->count < n) {
               stb_ps_array *a = (stb_ps_array *) malloc(sizeof(*a) + (n-1) * sizeof(a->p[0]));
               int i,j=0;
               for (i=0; i < h->size; ++i)
                  if (!stb_ps_empty(t[i]))
                     a->p[j++] = t[i];
               assert(j == h->count);
               a->count = j;
               free(h);
               return EncodeArray(a);
            }
         }
         if (h->count == h->shrink_threshhold) {
            stb_ps_hash *h2 = stb_ps_makehash(h->size >> 1, h->size, t);
            free(h);
            return EncodeHash(h2);
         }
         return ps;
      }
   }
   return ps; /* NOTREACHED */
}